

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  bool bVar1;
  reference this_00;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  string local_1e8;
  reference local_1c8;
  Tree *folder;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Tree,_std::allocator<Tree>_> *__range1_1;
  cmAlphaNum local_178;
  string local_148;
  allocator<char> local_121;
  string local_120;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  reference local_48;
  string *f;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *fsPath_local;
  string *virtualFolderPath_local;
  cmXMLWriter *xml_local;
  Tree *this_local;
  
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->files);
  f = (string *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->files);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&f);
    if (!bVar1) break;
    local_48 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Unit",&local_69);
    cmXMLWriter::StartElement(xml,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    cmAlphaNum::cmAlphaNum(&local_d0,fsPath);
    cmAlphaNum::cmAlphaNum(&local_100,&this->path);
    cmStrCat<char[2],std::__cxx11::string>
              (&local_a0,&local_d0,&local_100,(char (*) [2])0xd8fef2,local_48);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Option",&local_121);
    cmXMLWriter::StartElement(xml,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    cmAlphaNum::cmAlphaNum(&local_178,"CMake Files\\");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1_1,virtualFolderPath);
    cmStrCat<std::__cxx11::string,char[2]>
              (&local_148,&local_178,(cmAlphaNum *)&__range1_1,&this->path,(char (*) [2])0xd5a495);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  folder = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> *
                       )&folder);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator*(&__end1_1);
    local_1c8 = this_00;
    cmAlphaNum::cmAlphaNum(&local_218,virtualFolderPath);
    cmAlphaNum::cmAlphaNum(&local_248,&this->path);
    cmStrCat<char[2]>(&local_1e8,&local_218,&local_248,(char (*) [2])0xd5a495);
    cmAlphaNum::cmAlphaNum(&local_298,fsPath);
    cmAlphaNum::cmAlphaNum(&local_2c8,&this->path);
    cmStrCat<char[2]>(&local_268,&local_298,&local_2c8,(char (*) [2])0xd8fef2);
    BuildUnitImpl(this_00,xml,&local_1e8,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1e8);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : this->files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", cmStrCat(fsPath, this->path, "/", f));

    xml.StartElement("Option");
    xml.Attribute(
      "virtualFolder",
      cmStrCat("CMake Files\\", virtualFolderPath, this->path, "\\"));
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : this->folders) {
    folder.BuildUnitImpl(xml, cmStrCat(virtualFolderPath, this->path, "\\"),
                         cmStrCat(fsPath, this->path, "/"));
  }
}